

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

string * __thiscall pbrt::RGBIlluminantSpectrum::ToString_abi_cxx11_(RGBIlluminantSpectrum *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  long in_RSI;
  string *in_RDI;
  float *in_stack_ffffffffffffffb8;
  RGBSigmoidPolynomial *in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffc8;
  byte bVar1;
  allocator<char> in_stack_ffffffffffffffcf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  DenselySampledSpectrum *in_stack_ffffffffffffffe8;
  
  args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 4);
  bVar1 = 0;
  if (*(long *)(in_RSI + 0x10) == 0) {
    std::allocator<char>::allocator();
    bVar1 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,
               (char *)CONCAT17(in_stack_ffffffffffffffcf,CONCAT16(1,in_stack_ffffffffffffffc8)),
               (allocator<char> *)in_stack_ffffffffffffffc0);
  }
  else {
    DenselySampledSpectrum::ToString_abi_cxx11_(in_stack_ffffffffffffffe8);
  }
  StringPrintf<pbrt::RGBSigmoidPolynomial_const&,float_const&,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffffcf,CONCAT16(bVar1,in_stack_ffffffffffffffc8)),
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,args_2);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  }
  return in_RDI;
}

Assistant:

std::string RGBIlluminantSpectrum::ToString() const {
    return StringPrintf("[ RGBIlluminantSpectrum: rsp: %s scale: %f illuminant: %s ]",
                        rsp, scale,
                        illuminant ? illuminant->ToString() : std::string("(nullptr)"));
}